

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::IGXMLScanner::normalizeAttValue
          (IGXMLScanner *this,XMLAttDef *attDef,XMLCh *attName,XMLCh *value,XMLBuffer *toFill)

{
  XMLByte XVar1;
  AttTypes AVar2;
  XMLByte *pXVar3;
  bool bVar4;
  bool bVar5;
  XMLSize_t XVar6;
  XMLSize_t XVar7;
  bool bVar8;
  XMLCh XVar9;
  ulong uVar10;
  XMLCh *pXVar11;
  byte local_41;
  
  if (attDef == (XMLAttDef *)0x0) {
    toFill->fIndex = 0;
    local_41 = 1;
  }
  else {
    AVar2 = attDef->fType;
    local_41 = attDef->fExternalAttribute ^ 1U | (uint)(AVar2 + ~NmTokens) < 0xfffffff9;
    toFill->fIndex = 0;
    if (AVar2 < Enumeration && AVar2 != AttTypes_Min) {
      bVar5 = true;
      bVar4 = false;
      do {
        bVar8 = false;
        while( true ) {
          while( true ) {
            XVar9 = *value;
            uVar10 = (ulong)(ushort)XVar9;
            if (XVar9 == L'<') {
              bVar5 = false;
              XMLScanner::emitError
                        (&this->super_XMLScanner,BracketInAttrValue,attName,(XMLCh *)0x0,
                         (XMLCh *)0x0,(XMLCh *)0x0);
              uVar10 = 0x3c;
            }
            else if (XVar9 == L'\xffff') {
              uVar10 = (ulong)(ushort)value[1];
              value = value + 1;
            }
            else if (XVar9 == L'\0') {
              return bVar5;
            }
            pXVar3 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable;
            XVar1 = pXVar3[uVar10];
            if (!bVar8) break;
            if (-1 < (char)XVar1) {
              XVar7 = toFill->fIndex;
              if (bVar4) {
                XVar6 = XVar7;
                if (XVar7 == toFill->fCapacity) {
                  XMLBuffer::ensureCapacity(toFill,1);
                  XVar6 = toFill->fIndex;
                }
                XVar7 = XVar6 + 1;
                toFill->fIndex = XVar7;
                toFill->fBuffer[XVar6] = L' ';
              }
              goto LAB_002a5905;
            }
            value = value + 1;
            bVar8 = true;
          }
          if (-1 < (char)XVar1) break;
          value = value + 1;
          bVar8 = true;
          if ((((this->super_XMLScanner).fStandalone == true) &&
              ((this->super_XMLScanner).fValidate == true && local_41 == 0)) &&
             ((!bVar4 ||
              ((((XMLCh)uVar10 != L' ' && ((ulong)(ushort)*value != 0)) &&
               ((char)pXVar3[(ushort)*value] < '\0')))))) {
            XMLValidator::emitError
                      ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,attName,
                       (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
        XVar7 = toFill->fIndex;
LAB_002a5905:
        if (XVar7 == toFill->fCapacity) {
          XMLBuffer::ensureCapacity(toFill,1);
          XVar7 = toFill->fIndex;
        }
        toFill->fIndex = XVar7 + 1;
        toFill->fBuffer[XVar7] = (XMLCh)uVar10;
        value = value + 1;
        bVar4 = true;
      } while( true );
    }
  }
  bVar5 = true;
  do {
    pXVar11 = value + 1;
    XVar9 = *value;
    if ((ushort)XVar9 < 0xd) {
      if ((ushort)XVar9 - 9 < 2) goto LAB_002a5986;
      if (XVar9 == L'\0') {
        return bVar5;
      }
    }
    else if (XVar9 == L'\r') {
LAB_002a5986:
      XVar9 = L' ';
      if (((this->super_XMLScanner).fStandalone == true) &&
         ((this->super_XMLScanner).fValidate == true && local_41 == 0)) {
        XMLValidator::emitError
                  ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,attName,(XMLCh *)0x0,
                   (XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    else if (XVar9 == L'<') {
      bVar5 = false;
      XMLScanner::emitError
                (&this->super_XMLScanner,BracketInAttrValue,attName,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
      XVar9 = L'<';
    }
    else if (XVar9 == L'\xffff') {
      XVar9 = value[1];
      pXVar11 = value + 2;
    }
    XVar7 = toFill->fIndex;
    if (XVar7 == toFill->fCapacity) {
      XMLBuffer::ensureCapacity(toFill,1);
      XVar7 = toFill->fIndex;
    }
    toFill->fIndex = XVar7 + 1;
    toFill->fBuffer[XVar7] = XVar9;
    value = pXVar11;
  } while( true );
}

Assistant:

bool IGXMLScanner::normalizeAttValue( const   XMLAttDef* const    attDef
                                      , const XMLCh* const        attName
                                      , const XMLCh* const        value
                                      ,       XMLBuffer&          toFill)
{
    // A simple state value for a whitespace processing state machine
    enum States
    {
        InWhitespace
        , InContent
    };

    // Get the type and name
    const XMLAttDef::AttTypes type = (attDef)?attDef->getType():XMLAttDef::CData;

    // check to see if it's a tokenized type that is declared externally 
    bool  isAttTokenizedExternal = (attDef)
                                   ?attDef->isExternal() && (type == XMLAttDef::ID || 
                                                             type == XMLAttDef::IDRef || 
                                                             type == XMLAttDef::IDRefs || 
                                                             type == XMLAttDef::Entity || 
                                                             type == XMLAttDef::Entities || 
                                                             type == XMLAttDef::NmToken || 
                                                             type == XMLAttDef::NmTokens)
                                   :false;

    // Assume its going to go fine, and empty the target buffer in preperation
    bool retVal = true;
    toFill.reset();

    //  Loop through the chars of the source value and normalize it according
    //  to the type.
    XMLCh nextCh;
    const XMLCh* srcPtr = value;

    if (type == XMLAttDef::CData || type > XMLAttDef::Notation) {
        //  Get the next character from the source. We have to watch for
        //  escaped characters (which are indicated by a 0xFFFF value followed
        //  by the char that was escaped.)
        while ((nextCh = *srcPtr++)!=0)
        {
            switch(nextCh)
            {
            // Do we have an escaped character ?
            case 0xFFFF:
                nextCh = *srcPtr++;
                break;
            case 0x09:
            case 0x0A:
            case 0x0D:
                // Check Validity Constraint for Standalone document declaration
                // XML 1.0, Section 2.9
                if (fStandalone && fValidate && isAttTokenizedExternal)
                {
                     // Can't have a standalone document declaration of "yes" if  attribute
                     // values are subject to normalisation
                     fValidator->emitError(XMLValid::NoAttNormForStandalone, attName);
                }
                nextCh = chSpace;
                break;
            case chOpenAngle:
                //  If its not escaped, then make sure its not a < character, which is
                //  not allowed in attribute values.
                emitError(XMLErrs::BracketInAttrValue, attName);
                retVal = false;
                break;
            }

            // Add this char to the target buffer
            toFill.append(nextCh);
        }
    }
    else {
        States curState = InContent;
        bool firstNonWS = false;
        //  Get the next character from the source. We have to watch for
        //  escaped characters (which are indicated by a 0xFFFF value followed
        //  by the char that was escaped.)
        while ((nextCh = *srcPtr)!=0)
        {
            // Do we have an escaped character ?
            if (nextCh == 0xFFFF)
            {
                nextCh = *++srcPtr;
            }
            else if (nextCh == chOpenAngle) {
                //  If its not escaped, then make sure its not a < character, which is
                //  not allowed in attribute values.
                emitError(XMLErrs::BracketInAttrValue, attName);
                retVal = false;
            }

            if (curState == InWhitespace)
            {
                if (!fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    if (firstNonWS)
                        toFill.append(chSpace);
                    curState = InContent;
                    firstNonWS = true;
                }
                else
                {
                    srcPtr++;
                    continue;
                }
            }
            else if (curState == InContent)
            {
                if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    curState = InWhitespace;
                    srcPtr++;

                    // Check Validity Constraint for Standalone document declaration
                    // XML 1.0, Section 2.9
                    if (fStandalone && fValidate && isAttTokenizedExternal)
                    {
                        if (!firstNonWS || (nextCh != chSpace && *srcPtr && fReaderMgr.getCurrentReader()->isWhitespace(*srcPtr)))
                        {
                            // Can't have a standalone document declaration of "yes" if  attribute
                            // values are subject to normalisation
                            fValidator->emitError(XMLValid::NoAttNormForStandalone, attName);
                        }
                    }
                    continue;
                }
                firstNonWS = true;
            }

            // Add this char to the target buffer
            toFill.append(nextCh);

            // And move up to the next character in the source
            srcPtr++;
        }
    }

    return retVal;
}